

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  Nullable<const_char_*> failure_msg;
  long lVar1;
  LogMessageFatal local_28;
  unsigned_long local_18;
  
  lVar1 = (long)count;
  local_18 = this->size_ - this->available_;
  local_28.super_LogMessage._0_8_ = lVar1;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_28,&local_18,
                           "static_cast<size_t>(count) <= size_ - available_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this->available_ = this->available_ + lVar1;
    this->bytes_remaining_ = this->bytes_remaining_ + lVar1;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x20a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}